

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxxopts.hpp
# Opt level: O0

String * cxxopts::(anonymous_namespace)::format_option_abi_cxx11_(HelpOptionDetails *o)

{
  ulong uVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  String *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> arg;
  string *l;
  string *s;
  String *result;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffea0;
  String *__lhs;
  OptionNames *in_stack_fffffffffffffec0;
  allocator<char> *in_stack_fffffffffffffed0;
  char *in_stack_fffffffffffffed8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffee0;
  char *in_stack_fffffffffffffee8;
  string local_100 [32];
  string local_e0 [32];
  string local_c0 [38];
  byte local_9a;
  undefined1 local_99 [33];
  string local_78 [32];
  string local_58 [54];
  allocator<char> local_22;
  byte local_21;
  string *local_20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_10;
  
  __lhs = in_RDI;
  local_18 = in_RSI;
  local_10 = in_RSI;
  local_20 = first_or_empty(in_stack_fffffffffffffec0);
  local_21 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,in_stack_fffffffffffffed0);
  std::allocator<char>::~allocator(&local_22);
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    toLocalString<std::__cxx11::string_const&>(local_18);
    std::operator+(in_stack_fffffffffffffee8,in_stack_fffffffffffffee0);
    std::__cxx11::string::operator+=((string *)in_RDI,local_58);
    std::__cxx11::string::~string(local_58);
    uVar1 = std::__cxx11::string::empty();
    if ((uVar1 & 1) == 0) {
      std::__cxx11::string::operator+=((string *)in_RDI,",");
    }
  }
  else {
    std::__cxx11::string::operator+=((string *)in_RDI,"   ");
  }
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    toLocalString<std::__cxx11::string_const&>(local_20);
    std::operator+(in_stack_fffffffffffffee8,in_stack_fffffffffffffee0);
    std::__cxx11::string::operator+=((string *)in_RDI,local_78);
    std::__cxx11::string::~string(local_78);
  }
  uVar1 = std::__cxx11::string::empty();
  local_9a = 0;
  if ((uVar1 & 1) == 0) {
    pbVar2 = toLocalString<std::__cxx11::string_const&>
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &local_10[5]._M_string_length);
    std::__cxx11::string::string((string *)(local_99 + 1),(string *)pbVar2);
  }
  else {
    in_stack_fffffffffffffea0 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_99;
    std::allocator<char>::allocator();
    local_9a = 1;
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,in_stack_fffffffffffffed0);
  }
  if ((local_9a & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)local_99);
  }
  if ((local_10[6]._M_string_length & 0x100) == 0) {
    if (((byte)local_10[4]._M_dataplus & 1) == 0) {
      std::operator+(in_stack_fffffffffffffee8,in_stack_fffffffffffffee0);
      std::__cxx11::string::operator+=((string *)in_RDI,(string *)&stack0xfffffffffffffec0);
      std::__cxx11::string::~string((string *)&stack0xfffffffffffffec0);
    }
    else {
      std::operator+(in_stack_fffffffffffffee8,in_stack_fffffffffffffee0);
      std::operator+(__lhs,(char *)in_stack_fffffffffffffea0);
      toLocalString<std::__cxx11::string_const&>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &local_10[4]._M_string_length);
      std::operator+(__lhs,in_stack_fffffffffffffea0);
      std::operator+(__lhs,(char *)in_stack_fffffffffffffea0);
      std::__cxx11::string::operator+=((string *)in_RDI,local_c0);
      std::__cxx11::string::~string(local_c0);
      std::__cxx11::string::~string(local_e0);
      std::__cxx11::string::~string(local_100);
      std::__cxx11::string::~string((string *)&stack0xfffffffffffffee0);
    }
  }
  local_21 = 1;
  std::__cxx11::string::~string((string *)(local_99 + 1));
  if ((local_21 & 1) == 0) {
    std::__cxx11::string::~string((string *)in_RDI);
  }
  return __lhs;
}

Assistant:

String
format_option
(
  const HelpOptionDetails& o
)
{
  const auto& s = o.s;
  const auto& l = first_or_empty(o.l);

  String result = "  ";

  if (!s.empty())
  {
    result += "-" + toLocalString(s);
    if (!l.empty())
    {
      result += ",";
    }
  }
  else
  {
    result += "   ";
  }

  if (!l.empty())
  {
    result += " --" + toLocalString(l);
  }

  auto arg = !o.arg_help.empty() ? toLocalString(o.arg_help) : "arg";

  if (!o.is_boolean)
  {
    if (o.has_implicit)
    {
      result += " [=" + arg + "(=" + toLocalString(o.implicit_value) + ")]";
    }
    else
    {
      result += " " + arg;
    }
  }

  return result;
}